

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.h
# Opt level: O0

ZyanStatus ZydisStringAppend(ZyanString *destination,ZyanStringView *source)

{
  ZyanStringView *source_local;
  ZyanString *destination_local;
  
  if ((destination == (ZyanString *)0x0) || (source == (ZyanStringView *)0x0)) {
    __assert_fail("destination && source",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/include/Zydis/Internal/String.h"
                  ,0x86,"ZyanStatus ZydisStringAppend(ZyanString *, const ZyanStringView *)");
  }
  if ((destination->vector).allocator != (ZyanAllocator *)0x0) {
    __assert_fail("!destination->vector.allocator",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/include/Zydis/Internal/String.h"
                  ,0x87,"ZyanStatus ZydisStringAppend(ZyanString *, const ZyanStringView *)");
  }
  if (((destination->vector).size != 0) && ((source->string).vector.size != 0)) {
    if ((destination->vector).capacity <
        ((destination->vector).size + (source->string).vector.size) - 1) {
      destination_local._4_4_ = 0x80100009;
    }
    else {
      memcpy((void *)((long)(destination->vector).data + ((destination->vector).size - 1)),
             (source->string).vector.data,(source->string).vector.size - 1);
      (destination->vector).size = ((source->string).vector.size - 1) + (destination->vector).size;
      *(undefined1 *)((long)(destination->vector).data + ((destination->vector).size - 1)) = 0;
      destination_local._4_4_ = 0x100000;
    }
    return destination_local._4_4_;
  }
  __assert_fail("destination->vector.size && source->string.vector.size",
                "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/include/Zydis/Internal/String.h"
                ,0x88,"ZyanStatus ZydisStringAppend(ZyanString *, const ZyanStringView *)");
}

Assistant:

ZYAN_INLINE ZyanStatus ZydisStringAppend(ZyanString* destination, const ZyanStringView* source)
{
    ZYAN_ASSERT(destination && source);
    ZYAN_ASSERT(!destination->vector.allocator);
    ZYAN_ASSERT(destination->vector.size && source->string.vector.size);

    if (destination->vector.size + source->string.vector.size - 1 > destination->vector.capacity)
    {
        return ZYAN_STATUS_INSUFFICIENT_BUFFER_SIZE;
    }

    ZYAN_MEMCPY((char*)destination->vector.data + destination->vector.size - 1,
        source->string.vector.data, source->string.vector.size - 1);

    destination->vector.size += source->string.vector.size - 1;
    ZYDIS_STRING_NULLTERMINATE(destination);

    return ZYAN_STATUS_SUCCESS;
}